

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<FoundDelimiter,_4UL>::reserve
          (ArrayWithPreallocation<FoundDelimiter,_4UL> *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  FoundDelimiter *pFVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FoundDelimiter *pFVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  
  uVar3 = this->numAllocated;
  if (uVar3 < minSize) {
    uVar11 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar11 != 0) {
      pFVar8 = (FoundDelimiter *)operator_new__(uVar11 << 5);
      sVar9 = this->numActive;
      if (sVar9 != 0) {
        pFVar4 = this->items;
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pFVar4->range).outerStart + lVar10);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(pFVar4->range).delimiterLength + lVar10);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pFVar8->range).delimiterLength + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)((long)&(pFVar8->range).outerStart + lVar10);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          lVar10 = lVar10 + 0x20;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
      if (4 < uVar3) {
        if (this->items != (FoundDelimiter *)0x0) {
          operator_delete__(this->items);
        }
        this->items = (FoundDelimiter *)this->space;
        this->numAllocated = 4;
      }
      this->items = pFVar8;
    }
    this->numAllocated = uVar11;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }